

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fClippingTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::anon_unknown_0::QuadFillTest::QuadFillTest
          (QuadFillTest *this,Context *context,char *name,char *description,
          WindowRectangle *viewport,Vec3 *d1,Vec3 *d2,Vec3 *center_)

{
  vector<deqp::gles2::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
  *this_00;
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  FillTriangle triangle2;
  value_type local_e8;
  undefined1 local_88 [24];
  undefined1 *puStack_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 *local_58;
  undefined1 *puStack_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 *local_38;
  undefined1 *puStack_30;
  
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,name,"polygon edge clipping");
  (this->super_TriangleFillTest).super_FillTest.super_RenderTestCase.super_TestCase.m_context =
       context;
  (this->super_TriangleFillTest).super_FillTest.m_viewport.left = 0x32;
  (this->super_TriangleFillTest).super_FillTest.m_viewport.bottom = 0x32;
  (this->super_TriangleFillTest).super_FillTest.m_viewport.width = 100;
  (this->super_TriangleFillTest).super_FillTest.m_viewport.height = 100;
  this_00 = &(this->super_TriangleFillTest).m_triangles;
  (this->super_TriangleFillTest).m_triangles.
  super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_TriangleFillTest).m_triangles.
  super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_TriangleFillTest).m_triangles.
  super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_TriangleFillTest).super_FillTest.super_RenderTestCase.super_TestCase.super_TestCase.
  super_TestNode._vptr_TestNode = (_func_int **)&PTR__TriangleFillTest_02126f08;
  fVar11 = (float)*(undefined8 *)d1->m_data;
  fVar12 = (float)((ulong)*(undefined8 *)d1->m_data >> 0x20);
  fVar3 = (float)*(undefined8 *)description * 40000.0;
  fVar4 = (float)((ulong)*(undefined8 *)description >> 0x20) * 40000.0;
  uVar1 = viewport->left;
  uVar2 = viewport->bottom;
  fVar13 = (float)uVar1 * 40000.0;
  fVar14 = (float)uVar2 * 40000.0;
  fVar15 = (float)viewport->width * 40000.0;
  local_e8.c2.m_data[0] = 0.0;
  local_e8.c2.m_data[1] = 0.0;
  local_e8.c2.m_data[2] = 0.0;
  local_e8.c2.m_data[3] = 0.0;
  local_e8.v2.m_data[0] = 0.0;
  local_e8.v2.m_data[1] = 0.0;
  local_e8.v2.m_data[2] = 0.0;
  local_e8.v2.m_data[3] = 0.0;
  local_e8.c1.m_data[0] = 0.0;
  local_e8.c1.m_data[1] = 0.0;
  local_e8.c1.m_data[2] = 0.0;
  local_e8.c1.m_data[3] = 0.0;
  local_e8.v1.m_data[0] = 0.0;
  local_e8.v1.m_data[1] = 0.0;
  local_e8.v1.m_data[2] = 0.0;
  local_e8.v1.m_data[3] = 0.0;
  local_e8.c0.m_data[0] = 0.0;
  local_e8.c0.m_data[1] = 0.0;
  local_e8.c0.m_data[2] = 0.0;
  local_e8.c0.m_data[3] = 0.0;
  local_e8.v0.m_data[0] = 0.0;
  local_e8.v0.m_data[1] = 0.0;
  local_e8.v0.m_data[2] = 0.0;
  local_e8.v0.m_data[3] = 0.0;
  local_88._16_8_ = &DAT_3f0000003f000000;
  puStack_70 = &DAT_3f0000003f000000;
  local_58 = &DAT_3f0000003f000000;
  puStack_50 = &DAT_3f0000003f000000;
  local_38 = &DAT_3f0000003f000000;
  puStack_30 = &DAT_3f0000003f000000;
  fVar5 = fVar11 + fVar3;
  fVar6 = fVar12 + fVar4;
  fVar7 = d1->m_data[2] + *(float *)(description + 8) * 40000.0;
  fVar8 = fVar5 + fVar13;
  fVar9 = fVar6 + fVar14;
  fVar10 = fVar7 + fVar15;
  local_88._4_4_ = fVar9;
  local_88._0_4_ = fVar8;
  local_88._12_4_ = 1.0;
  local_88._8_4_ = fVar10;
  fStack_64 = fVar6 - fVar14;
  local_68 = fVar5 - fVar13;
  fStack_5c = 1.0;
  fStack_60 = fVar7 - fVar15;
  fVar11 = fVar11 - fVar3;
  fVar12 = fVar12 - fVar4;
  fVar5 = d1->m_data[2] - *(float *)(description + 8) * 40000.0;
  fVar3 = fVar11 - fVar13;
  fVar4 = fVar12 - fVar14;
  fVar6 = fVar5 - fVar15;
  fStack_44 = fVar4;
  local_48 = fVar3;
  fStack_3c = 1.0;
  fStack_40 = fVar6;
  std::
  vector<deqp::gles2::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
  ::push_back(this_00,(value_type *)local_88);
  local_e8.c0.m_data[0] = 0.5;
  local_e8.c0.m_data[1] = 0.0;
  local_e8.c0.m_data[2] = 0.0;
  local_e8.c0.m_data[3] = 0.5;
  local_e8.c1.m_data[0] = 0.5;
  local_e8.c1.m_data[1] = 0.0;
  local_e8.c1.m_data[2] = 0.0;
  local_e8.c1.m_data[3] = 0.5;
  local_e8.c2.m_data[0] = 0.5;
  local_e8.c2.m_data[1] = 0.0;
  local_e8.c2.m_data[2] = 0.0;
  local_e8.c2.m_data[3] = 0.5;
  local_e8.v0.m_data[1] = fVar9;
  local_e8.v0.m_data[0] = fVar8;
  local_e8.v0.m_data[3] = 1.0;
  local_e8.v0.m_data[2] = fVar10;
  local_e8.v1.m_data[1] = fVar4;
  local_e8.v1.m_data[0] = fVar3;
  local_e8.v1.m_data[3] = 1.0;
  local_e8.v1.m_data[2] = fVar6;
  local_e8.v2.m_data[1] = fVar12 + fVar14;
  local_e8.v2.m_data[0] = fVar11 + fVar13;
  local_e8.v2.m_data[3] = 1.0;
  local_e8.v2.m_data[2] = fVar5 + fVar15;
  std::
  vector<deqp::gles2::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
  ::push_back(this_00,&local_e8);
  return;
}

Assistant:

QuadFillTest::QuadFillTest (Context& context, const char* name, const char* description, const rr::WindowRectangle& viewport, const tcu::Vec3& d1, const tcu::Vec3& d2, const tcu::Vec3& center_)
	: TriangleFillTest(context, name, description, viewport)
{
	const float		radius		= 40000.0f;
	const tcu::Vec4 center		= tcu::Vec4(center_.x(), center_.y(), center_.z(), 1.0f);
	const tcu::Vec4 halfWhite	= tcu::Vec4(0.5f, 0.5f, 0.5f, 0.5f);
	const tcu::Vec4 halfRed		= tcu::Vec4(0.5f, 0.0f, 0.0f, 0.5f);
	const tcu::Vec4	e1			= radius * tcu::Vec4(d1.x(), d1.y(), d1.z(), 0.0f);
	const tcu::Vec4	e2			= radius * tcu::Vec4(d2.x(), d2.y(), d2.z(), 0.0f);

	FillTriangle triangle1;
	FillTriangle triangle2;

	triangle1.c0 = halfWhite;
	triangle1.c1 = halfWhite;
	triangle1.c2 = halfWhite;
	triangle1.v0 = center + e1 + e2;
	triangle1.v1 = center + e1 - e2;
	triangle1.v2 = center - e1 - e2;
	m_triangles.push_back(triangle1);

	triangle2.c0 = halfRed;
	triangle2.c1 = halfRed;
	triangle2.c2 = halfRed;
	triangle2.v0 = center + e1 + e2;
	triangle2.v1 = center - e1 - e2;
	triangle2.v2 = center - e1 + e2;
	m_triangles.push_back(triangle2);
}